

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O1

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSetFrameQpRealtime::PostEncodeFrameHook
          (DatarateTestSetFrameQpRealtime *this,Encoder *encoder)

{
  SEARCH_METHODS *message;
  AssertionResult gtest_ar;
  int qp;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  AssertHelper local_38;
  internal local_30 [8];
  undefined8 *local_28;
  int local_1c;
  
  if (this->frame_ < this->total_frames_) {
    local_1c = 0;
    libaom_test::Encoder::Control(encoder,0x14,&local_1c);
    testing::internal::CmpHelperEQ<int,int>(local_30,"qp","frame_qp_",&local_1c,&this->frame_qp_);
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (local_28 == (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = (SEARCH_METHODS *)*local_28;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/datarate_test.cc"
                 ,0x2d7,(char *)message);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_40._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_40._M_head_impl + 8))();
      }
    }
    if (local_28 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_28 != local_28 + 2) {
        operator_delete((undefined8 *)*local_28);
      }
      operator_delete(local_28);
    }
  }
  return;
}

Assistant:

void PostEncodeFrameHook(::libaom_test::Encoder *encoder) override {
    if (frame_ >= total_frames_) return;
    int qp = 0;
    encoder->Control(AOME_GET_LAST_QUANTIZER_64, &qp);
    ASSERT_EQ(qp, frame_qp_);
  }